

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  String *pSVar1;
  bool bVar2;
  ValueType VVar3;
  ArrayIndex AVar4;
  Json *pJVar5;
  Value *pVVar6;
  LargestUInt value_00;
  LargestInt value_01;
  char *pcVar7;
  char cVar8;
  PrecisionType in_R8D;
  ArrayIndex index;
  String *key;
  double value_02;
  char *str;
  char *end;
  String local_70;
  Members local_50;
  char *local_38;
  
  VVar3 = Value::type(value);
  switch(VVar3) {
  case nullValue:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_01);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_70._M_dataplus._M_p);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_00);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_70._M_dataplus._M_p);
    break;
  case realValue:
    value_02 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)0x0,value_02,true,0,in_R8D);
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_70._M_dataplus._M_p);
    break;
  case stringValue:
    bVar2 = Value::getString(value,(char **)&local_50,&local_38);
    if (!bVar2) {
      return;
    }
    valueToQuotedStringN_abi_cxx11_
              (&local_70,
               (Json *)local_50.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               local_38 +
               -(long)local_50.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,SUB41(in_R8D,0));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_70._M_dataplus._M_p);
    break;
  case booleanValue:
    bVar2 = Value::asBool(value);
    pcVar7 = "false";
    if (bVar2) {
      pcVar7 = "true";
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar7,pcVar7 + ((ulong)bVar2 ^ 5));
    std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_00136e45;
  case arrayValue:
    cVar8 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar8);
    AVar4 = Value::size(value);
    if (AVar4 != 0) {
      index = 0;
      do {
        if (index != 0) {
          std::__cxx11::string::push_back(cVar8);
        }
        pVVar6 = Value::operator[](value,index);
        writeValue(this,pVVar6);
        index = index + 1;
      } while (AVar4 != index);
    }
    std::__cxx11::string::push_back(cVar8);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_50,value);
    pSVar1 = &this->document_;
    cVar8 = (char)pSVar1;
    std::__cxx11::string::push_back(cVar8);
    key = local_50.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (key != local_50.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back(cVar8);
        }
        valueToQuotedStringN_abi_cxx11_
                  (&local_70,(Json *)(key->_M_dataplus)._M_p,(char *)key->_M_string_length,0,
                   SUB41(in_R8D,0));
        std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)pSVar1);
        pVVar6 = Value::operator[](value,key);
        writeValue(this,pVVar6);
        key = key + 1;
      } while (key != local_50.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::push_back(cVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
  default:
    goto switchD_00136c47_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00136e45:
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
switchD_00136c47_default:
  return;
}

Assistant:

void FastWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    if (!dropNullPlaceholders_)
      document_ += "null";
    break;
  case intValue:
    document_ += valueToString(value.asLargestInt());
    break;
  case uintValue:
    document_ += valueToString(value.asLargestUInt());
    break;
  case realValue:
    document_ += valueToString(value.asDouble());
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      document_ += valueToQuotedStringN(str, static_cast<size_t>(end - str));
    break;
  }
  case booleanValue:
    document_ += valueToString(value.asBool());
    break;
  case arrayValue: {
    document_ += '[';
    ArrayIndex size = value.size();
    for (ArrayIndex index = 0; index < size; ++index) {
      if (index > 0)
        document_ += ',';
      writeValue(value[index]);
    }
    document_ += ']';
  } break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    document_ += '{';
    for (auto it = members.begin(); it != members.end(); ++it) {
      const String& name = *it;
      if (it != members.begin())
        document_ += ',';
      document_ += valueToQuotedStringN(name.data(), name.length());
      document_ += yamlCompatibilityEnabled_ ? ": " : ":";
      writeValue(value[name]);
    }
    document_ += '}';
  } break;
  }
}